

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

void __thiscall
sentencepiece::NBestSentencePieceText::NBestSentencePieceText
          (NBestSentencePieceText *this,NBestSentencePieceText *from)

{
  void *pvVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__NBestSentencePieceText_003b7068;
  google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::RepeatedPtrField
            (&this->nbests_,&from->nbests_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  return;
}

Assistant:

NBestSentencePieceText::NBestSentencePieceText(const NBestSentencePieceText& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      nbests_(from.nbests_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:sentencepiece.NBestSentencePieceText)
}